

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

iterator * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::erase
          (iterator *__return_storage_ptr__,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,iterator pos)

{
  Node *node;
  string *psVar1;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  
  local_28 = pos.super_UntypedMapIterator._16_8_;
  local_38 = (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
             pos.super_UntypedMapIterator.node_;
  uStack_30 = pos.super_UntypedMapIterator.m_._0_4_;
  uStack_2c = pos.super_UntypedMapIterator.m_._4_4_;
  std::
  __advance<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::iterator,long>
            (&local_38,1);
  *(undefined8 *)&(__return_storage_ptr__->super_UntypedMapIterator).bucket_index_ = local_28;
  (__return_storage_ptr__->super_UntypedMapIterator).node_ = (NodeBase *)local_38;
  (__return_storage_ptr__->super_UntypedMapIterator).m_ =
       (UntypedMapBase *)CONCAT44(uStack_2c,uStack_30);
  local_38 = this;
  psVar1 = absl::lts_20240722::log_internal::
           Check_EQImpl<google::protobuf::internal::UntypedMapBase_const*,google::protobuf::internal::KeyMapBase<google::protobuf::MapKey>*>
                     (&pos.super_UntypedMapIterator.m_,
                      (KeyMapBase<google::protobuf::MapKey> **)&local_38,
                      "pos.m_ == static_cast<Base*>(this)");
  if (psVar1 == (string *)0x0) {
    node = (Node *)CONCAT44(pos.super_UntypedMapIterator.node_._4_4_,
                            pos.super_UntypedMapIterator.node_._0_4_);
    internal::KeyMapBase<google::protobuf::MapKey>::erase_no_destroy
              (&this->super_KeyMapBase<google::protobuf::MapKey>,
               pos.super_UntypedMapIterator.bucket_index_,(KeyNode *)node);
    DestroyNode(this,node);
    return __return_storage_ptr__;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/map.h"
             ,0x645,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

iterator erase(iterator pos) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto next = std::next(pos);
    ABSL_DCHECK_EQ(pos.m_, static_cast<Base*>(this));
    auto* node = static_cast<Node*>(pos.node_);
    this->erase_no_destroy(pos.bucket_index_, node);
    DestroyNode(node);
    return next;
  }